

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>::
PerformDefaultAction
          (FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<MockProblemBuilder::MutCommonExpr_&(int)> *this_00;
  pointer pcVar1;
  Result pMVar2;
  bool bVar3;
  Action<MockProblemBuilder::MutCommonExpr_&(int)> *this_01;
  Result pMVar4;
  runtime_error *this_02;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  string message;
  long *local_48 [2];
  long local_38 [2];
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar5 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_001e37c4;
    this_00 = (OnCallSpec<MockProblemBuilder::MutCommonExpr_&(int)> *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar3 = OnCallSpec<MockProblemBuilder::MutCommonExpr_&(int)>::Matches(this_00,args);
  } while (!bVar3);
  if (this_00 != (OnCallSpec<MockProblemBuilder::MutCommonExpr_&(int)> *)0x0) {
    this_01 = OnCallSpec<MockProblemBuilder::MutCommonExpr_&(int)>::GetAction(this_00);
    pMVar4 = Action<MockProblemBuilder::MutCommonExpr_&(int)>::Perform(this_01,args);
    return pMVar4;
  }
LAB_001e37c4:
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_48);
  pMVar2 = DefaultValue<MockProblemBuilder::MutCommonExpr&>::address_;
  if (DefaultValue<MockProblemBuilder::MutCommonExpr&>::address_ != (Result)0x0) {
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    return pMVar2;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)local_48);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }